

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O3

void __thiscall jrtplib::RTPUDPv6Transmitter::AddLoopbackAddress(RTPUDPv6Transmitter *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  undefined1 auVar4 [16];
  
  p_Var2 = (_List_node_base *)&this->localIPs;
  do {
    p_Var2 = (((_List_base<in6_addr,_std::allocator<in6_addr>_> *)&p_Var2->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)&this->localIPs) {
      p_Var3 = (_List_node_base *)operator_new(0x20);
      p_Var2 = (_List_node_base *)
               CONCAT17(cRam000000000013e127,
                        CONCAT16(cRam000000000013e126,
                                 CONCAT15(cRam000000000013e125,
                                          CONCAT14(cRam000000000013e124,
                                                   CONCAT13(cRam000000000013e123,
                                                            CONCAT12(cRam000000000013e122,
                                                                     CONCAT11(cRam000000000013e121,
                                                                              std::
                                                  __throw_bad_array_new_length)))))));
      p_Var3[1]._M_next =
           (_List_node_base *)
           CONCAT17(cRam000000000013e11f,
                    CONCAT16(cRam000000000013e11e,
                             CONCAT15(cRam000000000013e11d,
                                      CONCAT14(cRam000000000013e11c,
                                               CONCAT13(cRam000000000013e11b,
                                                        CONCAT12(cRam000000000013e11a,
                                                                 CONCAT11(cRam000000000013e119,
                                                                          in6addr_loopback)))))));
      p_Var3[1]._M_prev = p_Var2;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &(this->localIPs).super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      return;
    }
    auVar4[0] = -(in6addr_loopback == *(char *)&p_Var2[1]._M_next);
    auVar4[1] = -(cRam000000000013e119 == *(undefined1 *)((long)&p_Var2[1]._M_next + 1));
    auVar4[2] = -(cRam000000000013e11a == *(undefined1 *)((long)&p_Var2[1]._M_next + 2));
    auVar4[3] = -(cRam000000000013e11b == *(undefined1 *)((long)&p_Var2[1]._M_next + 3));
    auVar4[4] = -(cRam000000000013e11c == *(undefined1 *)((long)&p_Var2[1]._M_next + 4));
    auVar4[5] = -(cRam000000000013e11d == *(undefined1 *)((long)&p_Var2[1]._M_next + 5));
    auVar4[6] = -(cRam000000000013e11e == *(undefined1 *)((long)&p_Var2[1]._M_next + 6));
    auVar4[7] = -(cRam000000000013e11f == *(undefined1 *)((long)&p_Var2[1]._M_next + 7));
    auVar4[8] = -(std::__throw_bad_array_new_length == *(code *)&p_Var2[1]._M_prev);
    auVar4[9] = -(cRam000000000013e121 == *(undefined1 *)((long)&p_Var2[1]._M_prev + 1));
    auVar4[10] = -(cRam000000000013e122 == *(undefined1 *)((long)&p_Var2[1]._M_prev + 2));
    auVar4[0xb] = -(cRam000000000013e123 == *(undefined1 *)((long)&p_Var2[1]._M_prev + 3));
    auVar4[0xc] = -(cRam000000000013e124 == *(undefined1 *)((long)&p_Var2[1]._M_prev + 4));
    auVar4[0xd] = -(cRam000000000013e125 == *(undefined1 *)((long)&p_Var2[1]._M_prev + 5));
    auVar4[0xe] = -(cRam000000000013e126 == *(undefined1 *)((long)&p_Var2[1]._M_prev + 6));
    auVar4[0xf] = -(cRam000000000013e127 == *(undefined1 *)((long)&p_Var2[1]._M_prev + 7));
  } while ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar4[0xf] >> 7) << 0xf) != 0xffff);
  return;
}

Assistant:

void RTPUDPv6Transmitter::AddLoopbackAddress()
{
	std::list<in6_addr>::const_iterator it;
	bool found = false;

	for (it = localIPs.begin() ; !found && it != localIPs.end() ; it++)
	{
		if ((*it) == in6addr_loopback)
			found = true;
	}

	if (!found)
		localIPs.push_back(in6addr_loopback);
}